

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_external_replayer_linux.hpp
# Opt level: O3

bool __thiscall
Fossilize::ExternalReplayer::Impl::is_process_complete(Impl *this,int *return_status)

{
  bool bVar1;
  __pid_t _Var2;
  uint uVar3;
  int *piVar4;
  uint uVar5;
  Progress PStack_88;
  
  if (this->pid == -1) {
    if (return_status == (int *)0x0) {
      return true;
    }
    uVar3 = this->wstatus;
    if (this->synthesized_exit_code == false) {
      uVar5 = uVar3 & 0x7f;
      if (uVar5 == 0) {
        uVar3 = uVar3 >> 8 & 0xff;
      }
      else {
        uVar3 = 0;
        if (0x1ffffff < (int)(uVar5 * 0x1000000 + 0x1000000)) {
          uVar3 = -uVar5;
        }
      }
    }
    *return_status = uVar3;
    return true;
  }
  _Var2 = waitpid(this->pid,&this->wstatus,1);
  if (_Var2 == 0) {
LAB_00183e54:
    bVar1 = false;
  }
  else {
    if (_Var2 < 1) {
      piVar4 = __errno_location();
      this->wstatus = -*piVar4;
      this->synthesized_exit_code = true;
    }
    else {
      uVar3 = this->wstatus & 0x7f;
      if ((uVar3 != 0) && ((int)(uVar3 * 0x1000000 + 0x1000000) < 0x2000000)) goto LAB_00183e54;
    }
    poll_progress(this,&PStack_88);
    reset_pid(this);
    if (return_status != (int *)0x0) {
      uVar3 = this->wstatus;
      if (this->synthesized_exit_code == false) {
        uVar5 = uVar3 & 0x7f;
        if (uVar5 == 0) {
          uVar3 = uVar3 >> 8 & 0xff;
        }
        else {
          uVar3 = 0;
          if (0x1ffffff < (int)(uVar5 * 0x1000000 + 0x1000000)) {
            uVar3 = -uVar5;
          }
        }
      }
      *return_status = uVar3;
    }
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool ExternalReplayer::Impl::is_process_complete(int *return_status)
{
	if (pid == -1)
	{
		if (return_status)
			*return_status = wstatus_to_return(wstatus, synthesized_exit_code);
		return true;
	}

	int ret;
	if ((ret = waitpid(pid, &wstatus, WNOHANG)) == 0)
		return false;

	// Child process can receive SIGCONT/SIGSTOP which is benign.
	if (ret > 0 && !WIFEXITED(wstatus) && !WIFSIGNALED(wstatus))
		return false;

	if (ret < 0)
	{
		// If we error out here, we will not be able to receive a functioning return code, so
		// just return -errno.
		wstatus = -errno;
		synthesized_exit_code = true;
	}

	// Pump the fifo through.
	ExternalReplayer::Progress progress = {};
	poll_progress(progress);

	reset_pid();

	if (return_status)
		*return_status = wstatus_to_return(wstatus, synthesized_exit_code);
	return true;
}